

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,151>::CompactCorrelationMatrix::
CompactCorrelationMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (CompactCorrelationMatrix *this,ControlRecord *cont,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  uint order;
  uint uVar1;
  uint ndigit;
  uint lines;
  _Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<double,_std::allocator<double>_>_>
  local_78;
  
  order = Type<32,_151>::CompactCorrelationMatrix::verifyUnsigned<char[4]>
                    ((int)(cont->
                          super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                          ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long>.
                          super__Head_base<3UL,_long,_false>._M_head_impl,(char (*) [4])"NNN");
  uVar1 = Type<32,_151>::CompactCorrelationMatrix::verifyUnsigned<char[7]>
                    ((int)(cont->
                          super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                          ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Head_base<2UL,_long,_false>._M_head_impl,(char (*) [7])"NDIGIT");
  lines = 0x1362d5;
  ndigit = Type<32,_151>::CompactCorrelationMatrix::verifyUnsigned<char[3]>
                     ((int)((_Head_base<4UL,_long,_false> *)
                           ((long)&(cont->
                                   super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                                   ).fields.
                                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                                   super__Tuple_impl<3UL,_long,_long,_long>.
                                   super__Tuple_impl<4UL,_long,_long> + 8))->_M_head_impl,
                      (char (*) [3])"NM");
  readMatrixElements<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&local_78,(CompactCorrelationMatrix *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,MF,MT,uVar1,ndigit,lines);
  uVar1 = Type<32,_151>::CompactCorrelationMatrix::verifyUnsigned<char[7]>
                    ((int)(cont->
                          super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                          ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Head_base<2UL,_long,_false>._M_head_impl,(char (*) [7])"NDIGIT");
  Type<32,_151>::CompactCorrelationMatrix::CompactCorrelationMatrix
            ((CompactCorrelationMatrix *)this,order,
             (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&local_78,uVar1);
  std::
  _Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_78);
  return;
}

Assistant:

CompactCorrelationMatrix( ControlRecord&& cont,
                          Iterator& begin,
                          const Iterator& end,
                          long& lineNumber,
                          int MAT, int MF, int MT ) :
  CompactCorrelationMatrix(
      verifyUnsigned( cont.L2(), "NNN" ),
      readMatrixElements( begin, end, lineNumber, MAT, MF, MT,
                          verifyUnsigned( cont.L1(), "NDIGIT" ),
                          verifyUnsigned( cont.N1(), "NM" ) ),
      verifyUnsigned( cont.L1(), "NDIGIT" ) ) {}